

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testanimators.cpp
# Opt level: O0

void create_hacked_option_button(void)

{
  ushort uVar1;
  undefined8 uVar2;
  Am_Wrapper *pAVar3;
  Am_Value_List *this;
  Am_Object *pAVar4;
  Am_Constraint *pAVar5;
  Am_Method_Wrapper *pAVar6;
  Am_Object AVar7;
  ulong uVar8;
  Am_Object local_170;
  Am_Object local_168;
  Am_Object local_160;
  Am_Object local_158;
  Am_Object local_150;
  Am_Object local_148;
  Am_Object local_140;
  Am_Object local_138;
  Am_Object local_130;
  Am_Object local_128;
  Am_Object local_120;
  Am_Object menu_fade_group4;
  Am_Object local_110;
  Am_Object option4;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object menu_fade_group3;
  Am_Object local_c8;
  Am_Object option3;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object menu_fade_group2;
  Am_Object local_80;
  Am_Object option2;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Value_List local_30 [32];
  Am_Object local_10;
  
  Am_Object::Create((char *)&local_10);
  uVar1 = Am_Object::Set((ushort)&local_10,100,0);
  uVar1 = Am_Object::Set(uVar1,0x65,0);
  Am_Value_List::Am_Value_List(local_30);
  uVar2 = Am_Value_List::Add(local_30,"Option Menu First item",1);
  uVar2 = Am_Value_List::Add(uVar2,"Another menu item",1);
  Am_Object::Create((char *)&local_38);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_38);
  uVar2 = Am_Value_List::Add(uVar2,pAVar3,1);
  uVar2 = Am_Value_List::Add(uVar2,"Not active",1);
  uVar2 = Am_Value_List::Add(uVar2,"Item 4",1);
  uVar2 = Am_Value_List::Add(uVar2,"Item 5",1);
  this = (Am_Value_List *)Am_Value_List::Add(uVar2,"Last item",1);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(this);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xa2,(ulong)pAVar3);
  Am_Object::operator=(&menu,pAVar4);
  Am_Object::~Am_Object(&local_38);
  Am_Value_List::~Am_Value_List(local_30);
  Am_Object::~Am_Object(&local_10);
  Am_Object::Create((char *)&local_40);
  uVar1 = Am_Object::Set((ushort)&local_40,true,0);
  uVar1 = Am_Object::Set(uVar1,100,10);
  uVar1 = Am_Object::Set(uVar1,0x65,0xfa);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)width_of_menu);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x66,(ulong)pAVar5);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar1,true,0);
  Am_Object::operator=(&option_button,pAVar4);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Get_Object((ushort)&local_48,0x1125a8);
  Am_Object::Set((ushort)&local_48,true,0);
  Am_Object::~Am_Object(&local_48);
  Am_Object::Create((char *)&local_50);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&option_button);
  uVar1 = Am_Object::Add((ushort)&local_50,(Am_Wrapper *)0x1d3,(ulong)pAVar3);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)button_left_m2);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x64,(ulong)pAVar5);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)button_top_p_28);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x65,(ulong)pAVar5);
  uVar1 = Am_Object::Set(uVar1,true,0);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)width_of_menu);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x66,(ulong)pAVar5);
  pAVar5 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Height_Of_Parts);
  uVar1 = Am_Object::Set(uVar1,(Am_Constraint *)0x67,(ulong)pAVar5);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar1,0x169,0);
  Am_Object::operator=(&menu_fade_group,pAVar4);
  Am_Object::~Am_Object(&local_50);
  Am_Object::Get_Object((ushort)&local_58,0x1125a8);
  uVar1 = Am_Object::Set((ushort)&local_58,(char *)0x150,0x10e1d7);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&menu_fade_group);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x1d2,(ulong)pAVar3);
  pAVar6 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&pop_up_sub_menu);
  Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)pAVar6);
  Am_Object::~Am_Object(&local_58);
  Am_Object::Get_Object((ushort)&local_60,0x1126a8);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&option_button);
  uVar1 = Am_Object::Add((ushort)&local_60,(Am_Wrapper *)0x1d3,(ulong)pAVar3);
  pAVar6 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&pop_down_sub_menu);
  Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)pAVar6);
  Am_Object::~Am_Object(&local_60);
  Am_Object::Am_Object(&local_68,&menu);
  Am_Object::Add_Part(0x26a0,(Am_Object)0x1d2,(ulong)&local_68);
  Am_Object::~Am_Object(&local_68);
  Am_Object::Am_Object(&local_70,&option_button);
  AVar7.data = (Am_Object_Data *)Am_Object::Add_Part((Am_Object)0x1124c8,SUB81(&local_70,0),1);
  Am_Object::Am_Object(&option2,&menu_fade_group);
  Am_Object::Add_Part(AVar7,SUB81(&option2,0),1);
  Am_Object::~Am_Object(&option2);
  Am_Object::~Am_Object(&local_70);
  Am_Object::Copy((char *)&menu_fade_group2);
  pAVar4 = (Am_Object *)Am_Object::Set((ushort)&menu_fade_group2,100,0xdc);
  Am_Object::Am_Object(&local_80,pAVar4);
  Am_Object::~Am_Object(&menu_fade_group2);
  Am_Object::Copy((char *)&local_98);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_80);
  pAVar4 = (Am_Object *)Am_Object::Set((ushort)&local_98,(Am_Wrapper *)0x1d3,(ulong)pAVar3);
  Am_Object::Am_Object(&local_90,pAVar4);
  Am_Object::~Am_Object(&local_98);
  Am_Object::Get_Object((ushort)&local_a8,(ulong)&local_90);
  Am_Object::Get_Object((ushort)&local_a0,(ulong)&local_a8);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_80);
  Am_Object::Set((ushort)&local_a0,(Am_Wrapper *)0x1d3,(ulong)pAVar3);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::Get_Object((ushort)&local_b0,(ulong)&local_80);
  uVar1 = Am_Object::Set((ushort)&local_b0,(char *)0x150,0x10e1df);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_90);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x1d2,(ulong)pAVar3);
  pAVar6 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&pop_up_sub_menu);
  Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)pAVar6);
  Am_Object::~Am_Object(&local_b0);
  Am_Object::Am_Object(&local_b8,&local_80);
  AVar7.data = (Am_Object_Data *)Am_Object::Add_Part((Am_Object)0x1124c8,SUB81(&local_b8,0),1);
  Am_Object::Am_Object(&option3,&local_90);
  Am_Object::Add_Part(AVar7,SUB81(&option3,0),1);
  Am_Object::~Am_Object(&option3);
  Am_Object::~Am_Object(&local_b8);
  Am_Object::Copy((char *)&menu_fade_group3);
  uVar1 = Am_Object::Set((ushort)&menu_fade_group3,100,0xdc);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar1,0x65,0x4b);
  Am_Object::Am_Object(&local_c8,pAVar4);
  Am_Object::~Am_Object(&menu_fade_group3);
  Am_Object::Copy((char *)&local_e0);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_c8);
  pAVar4 = (Am_Object *)Am_Object::Set((ushort)&local_e0,(Am_Wrapper *)0x1d3,(ulong)pAVar3);
  Am_Object::Am_Object(&local_d8,pAVar4);
  Am_Object::~Am_Object(&local_e0);
  Am_Object::Get_Object((ushort)&local_f0,(ulong)&local_d8);
  Am_Object::Get_Object((ushort)&local_e8,(ulong)&local_f0);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_c8);
  Am_Object::Set((ushort)&local_e8,(Am_Wrapper *)0x1d3,(ulong)pAVar3);
  Am_Object::~Am_Object(&local_e8);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::Get_Object((ushort)&local_f8,(ulong)&local_c8);
  uVar1 = Am_Object::Set((ushort)&local_f8,(char *)0x150,0x10e1ec);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_d8);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x1d2,(ulong)pAVar3);
  pAVar6 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&pop_up_sub_menu);
  Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)pAVar6);
  Am_Object::~Am_Object(&local_f8);
  Am_Object::Am_Object(&local_100,&local_c8);
  AVar7.data = (Am_Object_Data *)Am_Object::Add_Part((Am_Object)0x1124c8,false,1);
  Am_Object::Am_Object(&option4,&local_d8);
  Am_Object::Add_Part(AVar7,SUB81(&option4,0),1);
  Am_Object::~Am_Object(&option4);
  Am_Object::~Am_Object(&local_100);
  Am_Object::Copy((char *)&menu_fade_group4);
  pAVar4 = (Am_Object *)Am_Object::Set((ushort)&menu_fade_group4,100,0x1ae);
  Am_Object::Am_Object(&local_110,pAVar4);
  Am_Object::~Am_Object(&menu_fade_group4);
  Am_Object::Copy((char *)&local_128);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_110);
  pAVar4 = (Am_Object *)Am_Object::Set((ushort)&local_128,(Am_Wrapper *)0x1d3,(ulong)pAVar3);
  Am_Object::Am_Object(&local_120,pAVar4);
  Am_Object::~Am_Object(&local_128);
  Am_Object::Get_Object((ushort)&local_138,(ulong)&local_120);
  Am_Object::Get_Object((ushort)&local_130,(ulong)&local_138);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_110);
  Am_Object::Set((ushort)&local_130,(Am_Wrapper *)0x1d3,(ulong)pAVar3);
  Am_Object::~Am_Object(&local_130);
  Am_Object::~Am_Object(&local_138);
  Am_Object::Get_Object((ushort)&local_140,(ulong)&local_110);
  uVar1 = Am_Object::Set((ushort)&local_140,(char *)0x150,0x10e1f8);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_120);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x1d2,(ulong)pAVar3);
  pAVar6 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&pop_up_sub_menu);
  Am_Object::Set(uVar1,(Am_Method_Wrapper *)0xca,(ulong)pAVar6);
  Am_Object::~Am_Object(&local_140);
  Am_Object::Am_Object(&local_148,&local_110);
  AVar7.data = (Am_Object_Data *)Am_Object::Add_Part((Am_Object)0x1124c8,SUB81(&local_148,0),1);
  Am_Object::Am_Object(&local_150,&local_120);
  Am_Object::Add_Part(AVar7,SUB81(&local_150,0),1);
  Am_Object::~Am_Object(&local_150);
  Am_Object::~Am_Object(&local_148);
  Am_Object::Create((char *)&local_158);
  pAVar4 = (Am_Object *)Am_Object::Set((ushort)&local_158,true,1);
  pAVar4 = (Am_Object *)Am_Object::operator=(&optionvisibleanimation,pAVar4);
  uVar8 = Am_Animate_With(pAVar4);
  Am_Object::Set(0x26a0,(Am_Constraint *)0x69,uVar8);
  Am_Object::~Am_Object(&local_158);
  Am_Object::Create((char *)&local_160);
  uVar1 = Am_Object::Set((ushort)&local_160,(Am_Value *)0x64,(ulong)&Am_No_Value);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar1,0x65,0xfffffc18);
  uVar8 = Am_Animate_With(pAVar4);
  Am_Object::Set((ushort)&local_90,(Am_Constraint *)0x69,uVar8);
  Am_Object::~Am_Object(&local_160);
  Am_Object::Create((char *)&local_168);
  uVar8 = Am_Animate_With(&local_168);
  Am_Object::Set((ushort)&local_d8,(Am_Constraint *)0x69,uVar8);
  Am_Object::~Am_Object(&local_168);
  Am_Object::Create((char *)&local_170);
  uVar1 = Am_Object::Set((ushort)&local_170,(Am_Value *)0x64,(ulong)&Am_No_Value);
  uVar1 = Am_Object::Set(uVar1,(Am_Value *)0x65,(ulong)&Am_No_Value);
  uVar1 = Am_Object::Set(uVar1,(Am_Value *)0x66,(ulong)&Am_No_Value);
  pAVar4 = (Am_Object *)Am_Object::Set(uVar1,0x67,1);
  uVar8 = Am_Animate_With(pAVar4);
  Am_Object::Set((ushort)&local_120,(Am_Constraint *)0x69,uVar8);
  Am_Object::~Am_Object(&local_170);
  Am_Object::~Am_Object(&local_120);
  Am_Object::~Am_Object(&local_110);
  Am_Object::~Am_Object(&local_d8);
  Am_Object::~Am_Object(&local_c8);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_80);
  return;
}

Assistant:

void
create_hacked_option_button()
{
  menu =
      Am_Menu.Create("my_option_menu")
          .Set(Am_LEFT, 0)
          .Set(Am_TOP, 0)
          .Set(Am_ITEMS, Am_Value_List()
                             .Add("Option Menu First item")
                             .Add("Another menu item")
                             .Add(Am_Menu_Line_Command.Create("my menu line"))
                             .Add("Not active")
                             .Add("Item 4")
                             .Add("Item 5")
                             .Add("Last item"));
  option_button = Am_Button.Create("pretent_option_button")
                      .Set(Am_LEAVE_ROOM_FOR_FRINGE, false)
                      .Set(Am_LEFT, 10)
                      .Set(Am_TOP, 250)
                      .Set(Am_WIDTH, width_of_menu)
                      .Set(Am_LEAVE_ROOM_FOR_FRINGE, false);
  option_button.Get_Object(Am_INTERACTOR).Set(Am_CONTINUOUS, false);
  menu_fade_group = Am_Fade_Group.Create("menu_Fade_Group")
                        .Add(Am_FOR_ITEM, option_button)
                        .Set(Am_LEFT, button_left_m2)
                        .Set(Am_TOP, button_top_p_28)
                        .Set(Am_VISIBLE, false)
                        .Set(Am_WIDTH, width_of_menu)
                        .Set(Am_HEIGHT, Am_Height_Of_Parts)
                        .Set(Am_VALUE, 0);
  option_button.Get_Object(Am_COMMAND)
      .Set(Am_LABEL, "Push me")
      .Set(Am_SUB_MENU, menu_fade_group, Am_OK_IF_NOT_THERE)
      .Set(Am_DO_METHOD, pop_up_sub_menu);
  menu.Get_Object(Am_COMMAND)
      .Add(Am_FOR_ITEM, option_button)
      .Set(Am_DO_METHOD, pop_down_sub_menu);
  menu_fade_group.Add_Part(Am_SUB_MENU, menu);
  fade_group.Add_Part(option_button).Add_Part(menu_fade_group);

  Am_Object option2 = option_button.Copy().Set(Am_LEFT, 220);
  Am_Object menu_fade_group2 = menu_fade_group.Copy().Set(Am_FOR_ITEM, option2);
  menu_fade_group2.Get_Object(Am_SUB_MENU)
      .Get_Object(Am_COMMAND)
      .Set(Am_FOR_ITEM, option2);
  option2.Get_Object(Am_COMMAND)
      .Set(Am_LABEL, "Push me also")
      .Set(Am_SUB_MENU, menu_fade_group2, Am_OK_IF_NOT_THERE)
      .Set(Am_DO_METHOD, pop_up_sub_menu);
  fade_group.Add_Part(option2).Add_Part(menu_fade_group2);

  Am_Object option3 = option_button.Copy().Set(Am_LEFT, 220).Set(Am_TOP, 75);
  Am_Object menu_fade_group3 = menu_fade_group.Copy().Set(Am_FOR_ITEM, option3);
  menu_fade_group3.Get_Object(Am_SUB_MENU)
      .Get_Object(Am_COMMAND)
      .Set(Am_FOR_ITEM, option3);
  option3.Get_Object(Am_COMMAND)
      .Set(Am_LABEL, "Push me too")
      .Set(Am_SUB_MENU, menu_fade_group3, Am_OK_IF_NOT_THERE)
      .Set(Am_DO_METHOD, pop_up_sub_menu);
  fade_group.Add_Part(option3).Add_Part(menu_fade_group3);

  Am_Object option4 = option_button.Copy().Set(Am_LEFT, 430);
  Am_Object menu_fade_group4 = menu_fade_group.Copy().Set(Am_FOR_ITEM, option4);
  menu_fade_group4.Get_Object(Am_SUB_MENU)
      .Get_Object(Am_COMMAND)
      .Set(Am_FOR_ITEM, option4);
  option4.Get_Object(Am_COMMAND)
      .Set(Am_LABEL, "Another Push Me")
      .Set(Am_SUB_MENU, menu_fade_group4, Am_OK_IF_NOT_THERE)
      .Set(Am_DO_METHOD, pop_up_sub_menu);
  fade_group.Add_Part(option4).Add_Part(menu_fade_group4);

  menu_fade_group.Set(
      Am_VISIBLE, Am_Animate_With(optionvisibleanimation =
                                      Am_Visible_Animator.Create("fade_menu")
                                          .Set(Am_USE_FADING, true)));

  menu_fade_group2.Set(
      Am_VISIBLE, Am_Animate_With(Am_Visible_Animator.Create("fly_sub_menu")
                                      .Set(Am_LEFT, Am_No_Value)
                                      .Set(Am_TOP, -1000)));
  menu_fade_group3.Set(Am_VISIBLE, Am_Animate_With(Am_Fly_Apart_Animator.Create(
                                       "fly_apart_sub_menu")));
  menu_fade_group4.Set(
      Am_VISIBLE, Am_Animate_With(Am_Visible_Animator.Create("grow_sub_menu")
                                      .Set(Am_LEFT, Am_No_Value)
                                      .Set(Am_TOP, Am_No_Value)
                                      .Set(Am_WIDTH, Am_No_Value)
                                      .Set(Am_HEIGHT, 1)));
}